

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-item.c
# Opt level: O2

void borg_deinscribe(int i)

{
  ushort uVar1;
  uint uVar2;
  keycode_t k;
  long lVar3;
  
  if ((borg_items[i].tval == '\x1c') && (sv_food_slime_mold == (uint)borg_items[i].sval)) {
    return;
  }
  borg_keypress(0x7d);
  uVar1 = z_info->pack_size;
  uVar2 = (uint)uVar1;
  if (i < (int)(uint)uVar1) {
    k = (keycode_t)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[i];
  }
  else if ((uint)i < uVar1 + 0xb) {
    for (lVar3 = 0; (ulong)uVar1 * 0x388 - lVar3 != 0; lVar3 = lVar3 + 0x388) {
      if ((borg_items->curses[lVar3 + -0x26] != false) &&
         (**(char **)(borg_items->curses + lVar3 + -0x3a) == '{')) {
        borg_keypress(0x2f);
        uVar2 = (uint)z_info->pack_size;
        break;
      }
    }
    k = (keycode_t)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[(int)(i - uVar2)];
  }
  else {
    for (lVar3 = 0; (ulong)(uint)uVar1 * 0x388 + 0x2a60 != lVar3; lVar3 = lVar3 + 0x388) {
      if ((borg_items->curses[lVar3 + -0x26] != false) &&
         (**(char **)(borg_items->curses + lVar3 + -0x3a) == '{')) {
        borg_keypress(0x7c);
        uVar2 = (uint)z_info->pack_size;
        break;
      }
    }
    k = (i - uVar2) + 0x24;
  }
  borg_keypress(k);
  borg_keypress(0x79);
  borg_keypress(0x79);
  return;
}

Assistant:

void borg_deinscribe(int i)
{

    /* Ok to inscribe Slime Molds */
    if (borg_items[i].tval == TV_FOOD
        && borg_items[i].sval == sv_food_slime_mold)
        return;

    /* Label it */
    borg_keypress('}');

    /* Choose from inventory */
    if (i < INVEN_WIELD) {
        /* Choose the item */
        borg_keypress(all_letters_nohjkl[i]);
    }

    /* Choose from equipment */
    else {
        if (i < INVEN_FEET) {
            for (int j = 0; j < INVEN_WIELD; j++) {
                /* Go to equipment (if necessary) */
                if (borg_items[j].iqty && borg_items[j].note[0] == '{') {
                    borg_keypress('/');
                    break;
                }
            }
            /* Choose the item */
            borg_keypress(all_letters_nohjkl[i - INVEN_WIELD]);

        } 
        else {
            for (int j = 0; j <= INVEN_FEET; j++) {
                /* Go to quiver (if necessary) */
                if (borg_items[j].iqty && borg_items[j].note[0] == '{') {
                    borg_keypress('|');
                    break;
                }
            }
            /* Choose the item */
            borg_keypress('0' + (i - QUIVER_START));
        }
    }

    /* May ask for a confirmation */
    borg_keypress('y');
    borg_keypress('y');
}